

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccelf.c
# Opt level: O1

void resolve_common_syms(TCCState *s1)

{
  Section *pSVar1;
  size_t sVar2;
  char *pcVar3;
  char cVar4;
  long lVar5;
  uchar *puVar6;
  char local_438 [8];
  char buf [1024];
  
  if (0x18 < (long)symtab_section->data_offset) {
    puVar6 = symtab_section->data + 0x18;
    do {
      if (*(short *)(puVar6 + 6) == -0xe) {
        sVar2 = section_add(bss_section,*(Elf64_Addr *)(puVar6 + 0x10),*(int *)(puVar6 + 8));
        *(size_t *)(puVar6 + 8) = sVar2;
        *(short *)(puVar6 + 6) = (short)bss_section->sh_num;
      }
      puVar6 = puVar6 + 0x18;
    } while (puVar6 < symtab_section->data + symtab_section->data_offset);
  }
  set_elf_sym(symtab_section,text_section->data_offset,0,0x10,0,text_section->sh_num,"_etext");
  set_elf_sym(symtab_section,data_section->data_offset,0,0x10,0,data_section->sh_num,"_edata");
  set_elf_sym(symtab_section,bss_section->data_offset,0,0x10,0,bss_section->sh_num,"_end");
  add_init_array_defines(s1,".preinit_array");
  add_init_array_defines(s1,".init_array");
  add_init_array_defines(s1,".fini_array");
  if (1 < s1->nb_sections) {
    lVar5 = 1;
    do {
      pSVar1 = s1->sections[lVar5];
      if ((pSVar1->sh_type == 1) && ((pSVar1->sh_flags & 2) != 0)) {
        cVar4 = pSVar1->name[0];
        if (cVar4 != '\0') {
          pcVar3 = &pSVar1->field_0x79;
          do {
            if (((int)cVar4 - 0x3aU < 0xfffffff6 && ((int)cVar4 & 0xffffffdfU) - 0x5b < 0xffffffe6)
                && cVar4 != '_') goto LAB_0011092e;
            cVar4 = *pcVar3;
            pcVar3 = pcVar3 + 1;
          } while (cVar4 != '\0');
        }
        snprintf(local_438,0x400,"__start_%s",pSVar1->name);
        set_elf_sym(symtab_section,0,0,0x10,0,pSVar1->sh_num,local_438);
        snprintf(local_438,0x400,"__stop_%s",pSVar1->name);
        set_elf_sym(symtab_section,pSVar1->data_offset,0,0x10,0,pSVar1->sh_num,local_438);
      }
LAB_0011092e:
      lVar5 = lVar5 + 1;
    } while (lVar5 < s1->nb_sections);
  }
  return;
}

Assistant:

ST_FUNC void resolve_common_syms(TCCState* s1) {
  ElfW(Sym) * sym;

  /* Allocate common symbols in BSS.  */
  for_each_elem(symtab_section, 1, sym, ElfW(Sym)) {
    if (sym->st_shndx == SHN_COMMON) {
      /* symbol alignment is in st_value for SHN_COMMONs */
      sym->st_value = section_add(bss_section, sym->st_size, sym->st_value);
      sym->st_shndx = bss_section->sh_num;
    }
  }

  /* Now assign linker provided symbols their value.  */
  tcc_add_linker_symbols(s1);
}